

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O2

bool __thiscall
presolve::HPresolve::checkFillin
          (HPresolve *this,HighsHashTable<int,_int> *fillinCache,HighsInt row,HighsInt col)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  pointer piVar2;
  HighsInt HVar3;
  ValueType *pVVar4;
  int iVar5;
  vector<int,_std::allocator<int>_> *pvVar6;
  long lVar7;
  long lVar9;
  bool bVar10;
  int *piVar8;
  
  lVar9 = (long)col;
  iVar5 = 1 - ((this->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[row] +
              (this->colsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar9]);
  pvVar6 = &this->colhead;
  piVar8 = (this->colhead).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start + lVar9;
  pvVar1 = &this->Anext;
  while( true ) {
    lVar7 = (long)*piVar8;
    if (lVar7 == -1) {
      do {
        do {
          lVar9 = (long)(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start[lVar9];
          bVar10 = lVar9 == -1;
          if (bVar10) {
            return bVar10;
          }
          piVar2 = (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pvVar6 = pvVar1;
        } while ((piVar2[lVar9] == row) ||
                (pVVar4 = HighsHashTable<int,_int>::operator[](fillinCache,piVar2 + lVar9),
                *pVVar4 != 0));
        HVar3 = countFillin(this,(this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[lVar9]);
        *pVVar4 = HVar3 + 1;
        iVar5 = iVar5 + HVar3;
      } while (iVar5 <= (this->options->super_HighsOptionsStruct).presolve_substitution_maxfillin);
      return bVar10;
    }
    piVar2 = (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (((piVar2[lVar7] != row) &&
        (pVVar4 = HighsHashTable<int,_int>::find(fillinCache,piVar2 + lVar7),
        pVVar4 != (ValueType *)0x0)) &&
       (iVar5 = iVar5 + *pVVar4 + -1,
       (this->options->super_HighsOptionsStruct).presolve_substitution_maxfillin < iVar5)) break;
    piVar8 = (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start + lVar7;
  }
  return false;
}

Assistant:

bool HPresolve::checkFillin(HighsHashTable<HighsInt, HighsInt>& fillinCache,
                            HighsInt row, HighsInt col) {
  // check numerics against markowitz tolerance
  assert(rowpositions.size() == static_cast<size_t>(rowsize[row]));

  // check fillin against max fillin
  HighsInt fillin = -(rowsize[row] + colsize[col] - 1);

#if 1
  // first use fillin for rows where it is already computed
  for (HighsInt coliter = colhead[col]; coliter != -1;
       coliter = Anext[coliter]) {
    if (Arow[coliter] == row) continue;

    auto cachedFillin = fillinCache.find(Arow[coliter]);
    if (cachedFillin == nullptr) continue;

    fillin += (*cachedFillin - 1);
    if (fillin > options->presolve_substitution_maxfillin) return false;
  }

  // iterate over rows of substituted column again to count the fillin for the
  // remaining rows
  for (HighsInt coliter = colhead[col]; coliter != -1;
       coliter = Anext[coliter]) {
    assert(Acol[coliter] == col);

    if (Arow[coliter] == row) continue;

    HighsInt& cachedFillin = fillinCache[Arow[coliter]];

    if (cachedFillin != 0) continue;

    HighsInt rowfillin = countFillin(Arow[coliter]);
    cachedFillin = rowfillin + 1;
    fillin += rowfillin;

    if (fillin > options->presolve_substitution_maxfillin) return false;
    // we count a fillin of 1 if the column is not present in the row and
    // a fillin of zero otherwise. the fillin for the substituted column
    // itself was already counted before the loop so we skip that entry.
  }
#else
  for (HighsInt rowiter : rowpositions) {
    if (rowiter == pos) continue;
    for (coliter = colhead[col]; coliter != -1; coliter = Anext[coliter]) {
      assert(Acol[coliter] == col);

      if (rowiter != coliter &&
          findNonzero(Arow[coliter], Acol[rowiter]) == -1) {
        if (fillin == maxfillin) return false;
        fillin += 1;
      }
    }
  }
#endif

  return true;
}